

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int parse_record_header(st_ptls_record_t *rec,uint8_t *src)

{
  uint8_t uVar1;
  int iVar2;
  ushort uVar3;
  
  uVar1 = *src;
  rec->type = uVar1;
  rec->version = *(ushort *)(src + 1) << 8 | *(ushort *)(src + 1) >> 8;
  uVar3 = *(ushort *)(src + 3) << 8 | *(ushort *)(src + 3) >> 8;
  rec->length = (ulong)uVar3;
  iVar2 = 0x32;
  if (uVar3 <= (ushort)((uVar1 == '\x17' | 0x40) << 8)) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int parse_record_header(struct st_ptls_record_t *rec, const uint8_t *src)
{
    rec->type = src[0];
    rec->version = ntoh16(src + 1);
    rec->length = ntoh16(src + 3);

    if (rec->length >
        (size_t)(rec->type == PTLS_CONTENT_TYPE_APPDATA ? PTLS_MAX_ENCRYPTED_RECORD_SIZE : PTLS_MAX_PLAINTEXT_RECORD_SIZE))
        return PTLS_ALERT_DECODE_ERROR;

    return 0;
}